

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasmFPU_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::dasmFRestore<(moira::Instr)197,(moira::Mode)6,2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  int iVar1;
  char cVar2;
  long lVar3;
  char *pcVar4;
  undefined1 local_24 [20];
  
  cVar2 = 'f';
  lVar3 = 0;
  do {
    pcVar4 = str->ptr;
    str->ptr = pcVar4 + 1;
    *pcVar4 = cVar2;
    cVar2 = "frestore"[lVar3 + 1];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 8);
  if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
    pcVar4 = str->ptr;
    str->ptr = pcVar4 + 1;
    *pcVar4 = ' ';
  }
  else {
    iVar1 = (str->tab).raw;
    pcVar4 = str->ptr;
    do {
      str->ptr = pcVar4 + 1;
      *pcVar4 = ' ';
      pcVar4 = str->ptr;
    } while (pcVar4 < str->base + iVar1);
  }
  Op<(moira::Mode)6,2>((Ea<(moira::Mode)6,_2> *)local_24,this,op & 7,addr);
  StrWriter::operator<<(str,(Ea<(moira::Mode)6,_2> *)local_24);
  return;
}

Assistant:

void
Moira::dasmFRestore(StrWriter &str, u32 &addr, u16 op) const
{
    auto dn = _____________xxx (op);

    str << Ins<I>{} << str.tab << Op<M, S>(dn, addr);
}